

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_6::LineBufferTask::LineBufferTask
          (LineBufferTask *this,TaskGroup *group,Data *ofd,int number,int scanLineMin,
          int scanLineMax)

{
  LineBuffer *pLVar1;
  Data *pDVar2;
  int *piVar3;
  uint in_ECX;
  _func_int **in_RDX;
  void *__stat_loc;
  Task *in_RDI;
  TaskGroup *in_stack_ffffffffffffffa8;
  TaskGroup **ppTVar4;
  Data *in_stack_ffffffffffffffc0;
  int local_38 [5];
  int local_24;
  int local_20;
  uint local_1c;
  _func_int **local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  IlmThread_3_3::Task::Task(in_RDI,in_stack_ffffffffffffffa8);
  in_RDI->_vptr_Task = (_func_int **)&PTR__LineBufferTask_004f3c98;
  in_RDI[1]._vptr_Task = local_18;
  ppTVar4 = &in_RDI[1]._group;
  __stat_loc = (void *)(ulong)local_1c;
  pLVar1 = OutputFile::Data::getLineBuffer(in_stack_ffffffffffffffc0,(int)((ulong)ppTVar4 >> 0x20));
  *ppTVar4 = (TaskGroup *)pLVar1;
  LineBuffer::wait((LineBuffer *)in_RDI[1]._group,__stat_loc);
  if (((ulong)in_RDI[1]._group[8]._data & 1) == 0) {
    pDVar2 = (Data *)Array::operator_cast_to_char_((Array *)in_RDI[1]._group);
    in_RDI[1]._group[4]._data = pDVar2;
    *(uint *)&in_RDI[1]._group[5]._data =
         *(int *)((long)in_RDI[1]._vptr_Task + 0x8c) +
         local_1c * *(int *)(in_RDI[1]._vptr_Task + 0x24);
    local_38[0] = *(int *)&in_RDI[1]._group[5]._data + *(int *)(in_RDI[1]._vptr_Task + 0x24) + -1;
    piVar3 = std::min<int>(local_38,(int *)(in_RDI[1]._vptr_Task + 0x12));
    *(int *)((long)&in_RDI[1]._group[5]._data + 4) = *piVar3;
    *(undefined1 *)&in_RDI[1]._group[8]._data = 1;
  }
  piVar3 = std::max<int>((int *)(in_RDI[1]._group + 5),&local_20);
  *(int *)&in_RDI[1]._group[6]._data = *piVar3;
  piVar3 = std::min<int>((int *)((long)&in_RDI[1]._group[5]._data + 4),&local_24);
  *(int *)((long)&in_RDI[1]._group[6]._data + 4) = *piVar3;
  return;
}

Assistant:

LineBufferTask::LineBufferTask (
    TaskGroup*        group,
    OutputFile::Data* ofd,
    int               number,
    int               scanLineMin,
    int               scanLineMax)
    : Task (group), _ofd (ofd), _lineBuffer (_ofd->getLineBuffer (number))
{
    //
    // Wait for the lineBuffer to become available
    //

    _lineBuffer->wait ();

    //
    // Initialize the lineBuffer data if necessary
    //

    if (!_lineBuffer->partiallyFull)
    {
        _lineBuffer->endOfLineBufferData = _lineBuffer->buffer;

        _lineBuffer->minY = _ofd->minY + number * _ofd->linesInBuffer;

        _lineBuffer->maxY =
            min (_lineBuffer->minY + _ofd->linesInBuffer - 1, _ofd->maxY);

        _lineBuffer->partiallyFull = true;
    }

    _lineBuffer->scanLineMin = max (_lineBuffer->minY, scanLineMin);
    _lineBuffer->scanLineMax = min (_lineBuffer->maxY, scanLineMax);
}